

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O3

exr_result_t attr_destroy(exr_context_t ctxt,exr_attribute_t *attr)

{
  exr_attribute_type_t eVar1;
  exr_attr_m33d_t *peVar2;
  exr_attr_chlist_t *peVar3;
  exr_result_t eVar4;
  exr_result_t eVar5;
  
  eVar1 = attr->type;
  eVar5 = 0;
  eVar4 = 0;
  if ((int)eVar1 < 0x13) {
    if (eVar1 == EXR_ATTR_CHLIST) {
      eVar4 = exr_attr_chlist_destroy(ctxt,(attr->field_6).chlist);
      goto LAB_0011ed41;
    }
    if (eVar1 == EXR_ATTR_FLOAT_VECTOR) goto LAB_0011ecf4;
    eVar4 = eVar5;
    if (eVar1 != EXR_ATTR_PREVIEW) goto LAB_0011ed41;
    if (ctxt != (exr_context_t)0x0) {
      peVar2 = (attr->field_6).m33d;
      if (peVar2 != (exr_attr_m33d_t *)0x0) {
        if (((void *)peVar2->m[2] != (void *)0x0) && (peVar2->m[1] != 0.0)) {
          (*ctxt->free_fn)((void *)peVar2->m[2]);
        }
        peVar2->m[0] = 0.0;
        peVar2->m[1] = 0.0;
        peVar2->m[2] = 0.0;
      }
      goto LAB_0011ed41;
    }
  }
  else {
    if (eVar1 != EXR_ATTR_STRING) {
      if (eVar1 == EXR_ATTR_STRING_VECTOR) {
        eVar4 = exr_attr_string_vector_destroy(ctxt,(attr->field_6).stringvector);
      }
      else if (eVar1 == EXR_ATTR_OPAQUE) {
        eVar4 = exr_attr_opaquedata_destroy(ctxt,(attr->field_6).opaque);
      }
      goto LAB_0011ed41;
    }
LAB_0011ecf4:
    if (ctxt != (exr_context_t)0x0) {
      peVar3 = (attr->field_6).chlist;
      if (peVar3 != (exr_attr_chlist_t *)0x0) {
        if ((peVar3->entries != (exr_attr_chlist_entry_t *)0x0) && (0 < peVar3->num_alloced)) {
          (*ctxt->free_fn)(peVar3->entries);
        }
        peVar3->num_channels = 0;
        peVar3->num_alloced = 0;
        peVar3->entries = (exr_attr_chlist_entry_t *)0x0;
      }
      goto LAB_0011ed41;
    }
  }
  eVar4 = 2;
LAB_0011ed41:
  (*ctxt->free_fn)(attr);
  return eVar4;
}

Assistant:

static exr_result_t
attr_destroy (exr_context_t ctxt, exr_attribute_t* attr)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    switch (attr->type)
    {
        case EXR_ATTR_CHLIST:
            rv = exr_attr_chlist_destroy (ctxt, attr->chlist);
            break;
        case EXR_ATTR_FLOAT_VECTOR:
            rv = exr_attr_float_vector_destroy (ctxt, attr->floatvector);
            break;
        case EXR_ATTR_PREVIEW:
            rv = exr_attr_preview_destroy (ctxt, attr->preview);
            break;
        case EXR_ATTR_STRING:
            rv = exr_attr_string_destroy (ctxt, attr->string);
            break;
        case EXR_ATTR_STRING_VECTOR:
            rv = exr_attr_string_vector_destroy (ctxt, attr->stringvector);
            break;
        case EXR_ATTR_OPAQUE:
            rv = exr_attr_opaquedata_destroy (ctxt, attr->opaque);
            break;
        case EXR_ATTR_BOX2I:
        case EXR_ATTR_BOX2F:
        case EXR_ATTR_CHROMATICITIES:
        case EXR_ATTR_COMPRESSION:
        case EXR_ATTR_ENVMAP:
        case EXR_ATTR_LINEORDER:
        case EXR_ATTR_DOUBLE:
        case EXR_ATTR_FLOAT:
        case EXR_ATTR_INT:
        case EXR_ATTR_KEYCODE:
        case EXR_ATTR_M33F:
        case EXR_ATTR_M33D:
        case EXR_ATTR_M44F:
        case EXR_ATTR_M44D:
        case EXR_ATTR_RATIONAL:
        case EXR_ATTR_TILEDESC:
        case EXR_ATTR_TIMECODE:
        case EXR_ATTR_V2I:
        case EXR_ATTR_V2F:
        case EXR_ATTR_V2D:
        case EXR_ATTR_V3I:
        case EXR_ATTR_V3F:
        case EXR_ATTR_V3D:
        case EXR_ATTR_DEEP_IMAGE_STATE:
        case EXR_ATTR_UNKNOWN:
        case EXR_ATTR_LAST_KNOWN_TYPE:
        default: break;
    }
    /* we don't care about the string because they were built into the
     * allocation block of the attribute as necessary */
    ctxt->free_fn (attr);
    return rv;
}